

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O2

unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
cppcms::crypto::message_digest::create_by_name(string *namein)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  ssl_sha384 *this;
  string *in_RSI;
  pointer local_40;
  string name;
  
  (namein->_M_dataplus)._M_p = (pointer)0x0;
  std::__cxx11::string::string((string *)&name,in_RSI);
  for (uVar2 = 0; uVar3 = (ulong)uVar2, uVar3 < name._M_string_length; uVar2 = uVar2 + 1) {
    if ((byte)(name._M_dataplus._M_p[uVar3] + 0xbfU) < 0x1a) {
      name._M_dataplus._M_p[uVar3] = name._M_dataplus._M_p[uVar3] | 0x20;
    }
  }
  bVar1 = std::operator==(&name,"md5");
  if (bVar1) {
    md5();
  }
  else {
    bVar1 = std::operator==(&name,"sha1");
    if (!bVar1) {
      bVar1 = std::operator==(&name,"sha224");
      if (bVar1) {
        this = (ssl_sha384 *)operator_new(0x78);
        anon_unknown_3::ssl_sha224::ssl_sha224((ssl_sha224 *)this);
      }
      else {
        bVar1 = std::operator==(&name,"sha256");
        if (bVar1) {
          this = (ssl_sha384 *)operator_new(0x78);
          anon_unknown_3::ssl_sha256::ssl_sha256((ssl_sha256 *)this);
        }
        else {
          bVar1 = std::operator==(&name,"sha384");
          if (bVar1) {
            this = (ssl_sha384 *)operator_new(0xe0);
            anon_unknown_3::ssl_sha384::ssl_sha384(this);
          }
          else {
            bVar1 = std::operator==(&name,"sha512");
            if (!bVar1) goto LAB_002417f9;
            this = (ssl_sha384 *)operator_new(0xe0);
            anon_unknown_3::ssl_sha512::ssl_sha512((ssl_sha512 *)this);
          }
        }
      }
      (namein->_M_dataplus)._M_p = (pointer)this;
      goto LAB_002417f9;
    }
    sha1();
  }
  (namein->_M_dataplus)._M_p = local_40;
LAB_002417f9:
  std::__cxx11::string::~string((string *)&name);
  return (__uniq_ptr_data<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>,_true,_true>
          )(__uniq_ptr_data<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>,_true,_true>
            )namein;
}

Assistant:

std::unique_ptr<message_digest> message_digest::create_by_name(std::string const &namein)
	{
		std::unique_ptr<message_digest> d;
		std::string name = namein;
		for(unsigned i=0;i<name.size();i++)
			if('A' <= name[i] && name[i]<='Z')
				name[i] = name[i] - 'A' + 'a';
		if(name=="md5")
			d = md5();
		else if(name == "sha1")
			d = sha1();
		#ifdef CPPCMS_HAVE_GCRYPT
		else if(name == "sha224")
			d.reset(new gcrypt_digets(GCRY_MD_SHA224));
		else if(name == "sha256")
			d.reset(new gcrypt_digets(GCRY_MD_SHA256));
		else if(name == "sha384")
			d.reset(new gcrypt_digets(GCRY_MD_SHA384));
		else if(name == "sha512")
			d.reset(new gcrypt_digets(GCRY_MD_SHA512));
		#endif

		#ifdef CPPCMS_HAVE_OPENSSL
		else if(name == "sha224")
			d.reset(new ssl_sha224());
		else if(name == "sha256")
			d.reset(new ssl_sha256());
		else if(name == "sha384")
			d.reset(new ssl_sha384());
		else if(name == "sha512")
			d.reset(new ssl_sha512());
		#endif
		
		return d;
	}